

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntWeakPtr<Diligent::IPipelineState>::RefCntWeakPtr
          (RefCntWeakPtr<Diligent::IPipelineState> *this,IPipelineState *pObj)

{
  int iVar1;
  undefined4 extraout_var;
  RefCountersImpl *pRVar2;
  IPipelineState *pObj_local;
  RefCntWeakPtr<Diligent::IPipelineState> *this_local;
  
  this->m_pRefCounters = (RefCountersImpl *)0x0;
  this->m_pObject = pObj;
  if (this->m_pObject != (IPipelineState *)0x0) {
    iVar1 = (*(this->m_pObject->super_IDeviceObject).super_IObject._vptr_IObject[3])();
    pRVar2 = ClassPtrCast<Diligent::RefCountersImpl,Diligent::IReferenceCounters>
                       ((IReferenceCounters *)CONCAT44(extraout_var,iVar1));
    this->m_pRefCounters = pRVar2;
    RefCountersImpl::AddWeakRef(this->m_pRefCounters);
  }
  return;
}

Assistant:

explicit RefCntWeakPtr(T* pObj) noexcept :
        m_pRefCounters{nullptr},
        m_pObject{pObj}
    {
        if (m_pObject)
        {
            m_pRefCounters = ClassPtrCast<RefCountersImpl>(m_pObject->GetReferenceCounters());
            m_pRefCounters->AddWeakRef();
        }
    }